

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int awritefloat(char *file,float *data,int length)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  int local_30;
  int offset;
  int size;
  int fd;
  int length_local;
  float *data_local;
  char *file_local;
  
  size = length;
  _fd = data;
  data_local = (float *)file;
  __fd = open(file,0x241,0x1a4);
  if (__fd < 0) {
    fprintf(_stderr,"awritefloat: %s: can\'t create\n",data_local);
    perror("");
    file_local._4_4_ = -1;
  }
  else {
    size = size >> 0x18 & 0xffU | size >> 8 & 0xff00U | (size & 0xff00U) << 8 | size << 0x18;
    sVar2 = write(__fd,&size,4);
    if (sVar2 == 4) {
      size = size >> 0x18 & 0xffU | size >> 8 & 0xff00U | (size & 0xff00U) << 8 | size << 0x18;
      for (local_30 = 0; local_30 < size; local_30 = local_30 + 1) {
        _fd[local_30] =
             (float)((int)_fd[local_30] >> 0x18 & 0xffU | (int)_fd[local_30] >> 8 & 0xff00U |
                     ((uint)_fd[local_30] & 0xff00) << 8 | (int)_fd[local_30] << 0x18);
      }
      iVar1 = size << 2;
      sVar2 = write(__fd,_fd,(long)iVar1);
      if (sVar2 == iVar1) {
        for (local_30 = 0; local_30 < size; local_30 = local_30 + 1) {
          _fd[local_30] =
               (float)((int)_fd[local_30] >> 0x18 & 0xffU | (int)_fd[local_30] >> 8 & 0xff00U |
                       ((uint)_fd[local_30] & 0xff00) << 8 | (int)_fd[local_30] << 0x18);
        }
        printf("Wrote %d floats in %s.\n",(ulong)(uint)size,data_local);
        close(__fd);
        file_local._4_4_ = size;
      }
      else {
        fprintf(_stderr,"awritefloat: %s: can\'t write data\n",data_local);
        perror("");
        close(__fd);
        file_local._4_4_ = -1;
      }
    }
    else {
      fprintf(_stderr,"awritefloat: %s: can\'t write length\n",data_local);
      perror("");
      close(__fd);
      file_local._4_4_ = -1;
    }
  }
  return file_local._4_4_;
}

Assistant:

int
awritefloat (char *file,
	     float *data,
	     int length)
{
  int             fd;
  int             size;
  int             offset;

  if ((fd = open (file, O_CREAT | O_WRONLY | O_TRUNC | O_BINARY, 0644)) < 0)
  {
    fprintf (stderr, "awritefloat: %s: can't create\n", file);
    perror("");
    return -1;
  }

  SWAP_INT32(&length);
  if (write (fd, (char *) &length, 4) != 4)
  {
    fprintf (stderr, "awritefloat: %s: can't write length\n", file);
    perror("");
    close (fd);
    return -1;
  }
  SWAP_INT32(&length);

  for(offset = 0; offset < length; offset++)
    SWAP_FLOAT32(data + offset);
  size = length * sizeof (float);
  if (write (fd, (char *) data, size) != size)
  {
    fprintf (stderr, "awritefloat: %s: can't write data\n", file);
    perror("");
    close (fd);
    return (-1);
  }
  for(offset = 0; offset < length; offset++)
    SWAP_FLOAT32(data + offset);

  printf ("Wrote %d floats in %s.\n", length, file);
  close (fd);
  return length;
}